

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O2

void __thiscall QSslServerPrivate::checkClientHelloAndContinue(QSslServerPrivate *this)

{
  byte bVar1;
  QSslServer *this_00;
  Entry *pEVar2;
  QObject *object;
  QSslSocket *this_01;
  long lVar3;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *pDVar4;
  RestrictedBool RVar5;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  iterator iVar8;
  Connection local_50;
  Connection __old_val;
  char byte;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslServer **)&(this->super_QTcpServerPrivate).field_0x8;
  object = (QObject *)QObject::sender();
  this_01 = QtPrivate::qobject_cast_helper<QSslSocket*,QObject>(object);
  if (this_01 == (QSslSocket *)0x0) goto LAB_00236e0d;
  lVar3 = (**(code **)(*(long *)&(this_01->super_QTcpSocket).super_QAbstractSocket + 0xa0))(this_01)
  ;
  if (lVar3 < 1) goto LAB_00236e0d;
  byte = '\0';
  lVar3 = QIODevice::peek((char *)this_01,(longlong)&byte);
  if (lVar3 == 1) {
    __old_val.d_ptr = this_01;
    iVar8 = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::findImpl<unsigned_long_long>
                      (&this->socketData,(unsigned_long_long *)&__old_val);
    pDVar4 = iVar8.i.d;
    if (pDVar4 == (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
                  0x0 && iVar8.i.bucket == 0) {
      if (byte != '\x16') goto LAB_00236df9;
    }
    else {
      uVar6 = iVar8.i.bucket >> 7;
      uVar7 = (uint)iVar8.i.bucket & 0x7f;
      RVar5 = QMetaObject::Connection::operator_cast_to__
                        ((Connection *)
                         (pDVar4->spans[uVar6].entries[pDVar4->spans[uVar6].offsets[uVar7]].storage.
                          data + 8));
      if (RVar5 != 0xffffffffffffffff) {
        pEVar2 = pDVar4->spans[uVar6].entries;
        bVar1 = pDVar4->spans[uVar6].offsets[uVar7];
        QMetaObject::Connection::Connection(&local_50);
        __old_val.d_ptr = *(void **)(pEVar2[bVar1].storage.data + 8);
        *(void **)(pEVar2[bVar1].storage.data + 8) = local_50.d_ptr;
        local_50.d_ptr = (void *)0x0;
        QObject::disconnect(&__old_val);
        QMetaObject::Connection::~Connection(&__old_val);
        QMetaObject::Connection::~Connection(&local_50);
      }
      if (byte != '\x16') {
LAB_00236df9:
        (**(code **)(*(long *)&(this_01->super_QTcpSocket).super_QAbstractSocket + 0x100))(this_01);
        goto LAB_00236e05;
      }
      QTimer::start();
    }
    QSslSocket::startServerEncryption(this_01);
    QSslServer::startedEncryptionHandshake(this_00,this_01);
  }
  else {
LAB_00236e05:
    QObject::deleteLater();
  }
LAB_00236e0d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::checkClientHelloAndContinue()
{
    Q_Q(QSslServer);
    QSslSocket *socket = qobject_cast<QSslSocket *>(q->sender());
    if (Q_UNLIKELY(!socket) || socket->bytesAvailable() <= 0)
        return;

    char byte = '\0';
    if (socket->peek(&byte, 1) != 1) {
        socket->deleteLater();
        return;
    }

    auto it = socketData.find(quintptr(socket));
    const bool foundData = it != socketData.end();
    if (foundData && it->readyReadConnection)
        QObject::disconnect(std::exchange(it->readyReadConnection, {}));

    constexpr char CLIENT_HELLO = 0x16;
    if (byte != CLIENT_HELLO) {
        socket->disconnectFromHost();
        socket->deleteLater();
        return;
    }

    // Be nice and restart the timeout timer since some progress was made
    if (foundData)
        it->timeoutTimer->start();

    socket->startServerEncryption();
    Q_EMIT q->startedEncryptionHandshake(socket);
}